

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
dlib::
add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>
::update_parameters<dlib::sgd>
          (add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>
           *this,sstack<dlib::sgd> solvers,double learning_rate)

{
  size_t sVar1;
  ostream *poVar2;
  ostream *poVar3;
  string *a;
  bn_<(dlib::layer_mode)0> *in_RDI;
  double dVar4;
  tensor *step;
  ostringstream dlib_o_out;
  tensor *in_stack_fffffffffffffd98;
  tensor *in_stack_fffffffffffffda0;
  bn_<(dlib::layer_mode)0> *in_stack_fffffffffffffdb0;
  tensor *in_stack_fffffffffffffdb8;
  error_type t;
  bn_<(dlib::layer_mode)0> *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  float learning_rate_00;
  sgd *in_stack_fffffffffffffdd0;
  ostringstream local_198 [328];
  sstack<dlib::sgd> *in_stack_ffffffffffffffb0;
  double in_stack_ffffffffffffffb8;
  add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>
  *in_stack_ffffffffffffffc0;
  sstack<dlib::sgd> in_stack_ffffffffffffffc8;
  sstack<dlib::sgd> local_10;
  
  learning_rate_00 = (float)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
  sVar1 = sstack<dlib::sgd>::size(&local_10);
  if (1 < sVar1) {
    sVar1 = tensor::size((tensor *)&in_RDI[1].means.super_tensor.m_nr);
    if (sVar1 != 0) {
      dVar4 = get_learning_rate_multiplier<dlib::bn_<(dlib::layer_mode)0>>
                        (in_stack_fffffffffffffdb0);
      if ((dVar4 != 0.0) || (NAN(dVar4))) {
        sstack<dlib::sgd>::top(in_stack_ffffffffffffffb0);
        sgd::operator()(in_stack_fffffffffffffdd0,learning_rate_00,in_stack_fffffffffffffdc0,
                        in_stack_fffffffffffffdb8);
        bn_<(dlib::layer_mode)0>::get_layer_params(in_RDI);
        bn_<(dlib::layer_mode)0>::get_layer_params(in_RDI);
        tt::add(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,(tensor *)0x22a035);
      }
    }
    std::
    unique_ptr<dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_std::default_delete<dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>_>_>
    ::operator->((unique_ptr<dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_std::default_delete<dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>_>_>
                  *)0x22a046);
    sstack<dlib::sgd>::pop
              ((sstack<dlib::sgd> *)in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
    add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>::
    update_parameters<dlib::sgd>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffb8);
    return;
  }
  dlib_assert_breakpoint();
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,"\n\nError detected at line ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3ed);
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<((ostream *)local_198,"Error detected in file ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/core.h"
                          );
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<((ostream *)local_198,"Error detected in function ");
  poVar2 = std::operator<<(poVar2,
                           "void dlib::add_layer<dlib::bn_<dlib::CONV_MODE>, dlib::add_layer<dlib::con_<64, 7, 7, 2, 2>, dlib::input_rgb_image>>::update_parameters(sstack<solver_type>, double) [LAYER_DETAILS = dlib::bn_<dlib::CONV_MODE>, SUBNET = dlib::add_layer<dlib::con_<64, 7, 7, 2, 2>, dlib::input_rgb_image>, enabled = void, solver_type = dlib::sgd]"
                          );
  std::operator<<(poVar2,".\n\n");
  poVar2 = std::operator<<((ostream *)local_198,"Failing expression was ");
  poVar2 = std::operator<<(poVar2,"solvers.size()>=num_computational_layers");
  std::operator<<(poVar2,".\n");
  poVar2 = (ostream *)std::ostream::operator<<(local_198,std::boolalpha);
  poVar3 = std::operator<<(poVar2,"");
  std::operator<<(poVar3,"\n");
  t = (error_type)((ulong)poVar3 >> 0x20);
  a = (string *)__cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  fatal_error::fatal_error((fatal_error *)poVar2,t,a);
  __cxa_throw(a,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

void update_parameters(sstack<solver_type> solvers, double learning_rate)
        {
            DLIB_CASSERT(solvers.size()>=num_computational_layers);
            // Don't try to adjust the parameters if this layer doesn't have any or the
            // learning rate is disabled for this layer.
            if (params_grad.size() != 0 && get_learning_rate_multiplier(details) != 0)
            {
                const tensor& step = solvers.top()(learning_rate, details, static_cast<const tensor&>(params_grad));
                tt::add(details.get_layer_params(), details.get_layer_params(), step);
            }
            subnetwork->update_parameters(solvers.pop(), learning_rate);
        }